

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_algorithms.h
# Opt level: O0

void __thiscall
Labeling2D<(Connectivity2D)8,_false>::Labeling2D(Labeling2D<(Connectivity2D)8,_false> *this)

{
  unique_ptr<YacclabTensorOutput2D,_std::default_delete<YacclabTensorOutput2D>_> local_20;
  unique_ptr<YacclabTensorInput2D,_std::default_delete<YacclabTensorInput2D>_> local_18;
  Labeling2D<(Connectivity2D)8,_false> *local_10;
  Labeling2D<(Connectivity2D)8,_false> *this_local;
  
  local_10 = this;
  std::make_unique<YacclabTensorInput2D>();
  std::make_unique<YacclabTensorOutput2D>();
  Labeling2D(this,&local_18,&local_20);
  std::unique_ptr<YacclabTensorOutput2D,_std::default_delete<YacclabTensorOutput2D>_>::~unique_ptr
            (&local_20);
  std::unique_ptr<YacclabTensorInput2D,_std::default_delete<YacclabTensorInput2D>_>::~unique_ptr
            (&local_18);
  return;
}

Assistant:

Labeling2D() : Labeling2D(std::make_unique<YacclabTensorInput2D>(), std::make_unique<YacclabTensorOutput2D>()) {}